

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O2

int * Ndr_ObjReadBodyP(Ndr_Data_t *p,int Obj,int Type)

{
  int iVar1;
  int i;
  
  i = Obj + 1;
  while( true ) {
    if ((int)(p->pBody[Obj] + Obj) <= i) {
      return (int *)0x0;
    }
    iVar1 = Ndr_DataType(p,i);
    if (iVar1 == 9) break;
    iVar1 = Ndr_DataSize(p,i);
    i = i + iVar1;
  }
  return (int *)(p->pBody + i);
}

Assistant:

static inline int * Ndr_ObjReadBodyP( Ndr_Data_t * p, int Obj, int Type )
{
    int Ent;
    Ndr_ObjForEachEntry( p, Obj, Ent )
        if ( Ndr_DataType(p, Ent) == Type )
            return Ndr_DataEntryP(p, Ent);
    return NULL;
}